

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::setupMemory(TranslateToFuzzReader *this)

{
  Random *pRVar1;
  char *pcVar2;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Module *pMVar7;
  Const *pCVar8;
  size_t j;
  size_t i;
  address64_t aVar9;
  ulong uVar10;
  Name name;
  Name name_00;
  Name NVar11;
  string_view sVar12;
  Name local_e0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  Literal local_b0;
  Literal local_98;
  undefined1 local_80 [16];
  Name local_70;
  size_t local_60;
  ulong local_58;
  Builder *local_50;
  long *local_48;
  int local_40;
  char local_39;
  _Head_base<0UL,_wasm::Memory_*,_false> local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  pMVar7 = this->wasm;
  local_48 = *(long **)(pMVar7 + 0x78);
  if (local_48 == *(long **)(pMVar7 + 0x80)) {
    Name::Name(&local_e0,"0");
    NVar11.super_IString.str._M_str = (char *)local_e0.super_IString.str._M_len;
    NVar11.super_IString.str._M_len = (size_t)&local_38;
    Builder::makeMemory(NVar11,(Address)local_e0.super_IString.str._M_str,(Address)0x0,false,
                        (Type)0x0);
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,10);
    ((local_38._M_head_impl)->initial).addr = (ulong)(uVar5 + 1);
    bVar4 = Random::oneIn(pRVar1,2);
    if (bVar4) {
      aVar9 = ((local_38._M_head_impl)->initial).addr;
      uVar5 = Random::upTo(pRVar1,4);
      aVar9 = aVar9 + uVar5;
    }
    else {
      aVar9 = 0xffffffffffffffff;
    }
    ((local_38._M_head_impl)->max).addr = aVar9;
    if (((byte)this->wasm[0x179] & 8) != 0) {
      bVar4 = Random::oneIn(pRVar1,2);
      if (bVar4) {
        ((local_38._M_head_impl)->addressType).id = 3;
      }
    }
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38);
    pMVar7 = this->wasm;
    local_48 = *(long **)(pMVar7 + 0x78);
  }
  if (((byte)pMVar7[0x178] & 0x10) == 0) {
    pRVar1 = &this->random;
    bVar4 = Random::oneIn(pRVar1,(uint)(*(long *)(pMVar7 + 0x90) == *(long *)(pMVar7 + 0x98)) * 8 +
                                 2);
    if (!bVar4) {
      Name::Name((Name *)local_d0,"");
      Name::Name((Name *)local_c0,"");
      name.super_IString.str._M_str = (char *)local_d0._0_8_;
      name.super_IString.str._M_len = (size_t)&local_38;
      Builder::makeDataSegment
                (name,(Name)stack0xffffffffffffff38,(bool)local_c0[8],(Expression *)0x0,(char *)0x0,
                 (Address)0x19daac);
      pcVar2 = (char *)((size_t *)*local_48)[1];
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
           *(size_t *)*local_48;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar2;
      Literal::makeFromInt32(&local_98,0,(Type)*(uintptr_t *)(*local_48 + 0x50));
      pCVar8 = Builder::makeConst(&this->builder,&local_98);
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)pCVar8;
      wasm::Literal::~Literal(&local_98);
      _Var3._M_head_impl = local_38._M_head_impl;
      pMVar7 = this->wasm;
      NVar11 = Name::fromInt(0);
      sVar12 = (string_view)Names::getValidDataSegmentName(pMVar7,NVar11);
      ((_Var3._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar12;
      ((_Var3._M_head_impl)->super_Importable).super_Named.hasExplicitName = false;
      uVar5 = Random::upTo(pRVar1,(int)(this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr * 2);
      uVar10 = (ulong)uVar5;
      while (bVar4 = uVar10 != 0, uVar10 = uVar10 - 1, bVar4) {
        uVar5 = Random::upTo(pRVar1,0x200);
        local_39 = (char)uVar5;
        if (0xff < uVar5) {
          local_39 = '\0';
        }
        std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  ((vector<char,_std::allocator<char>_> *)&(local_38._M_head_impl)->initial,
                   &local_39);
      }
      wasm::Module::addDataSegment((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
                ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_38
                );
    }
  }
  else {
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,8);
    local_58 = 1;
    if (*(long *)(this->wasm + 0x90) != *(long *)(this->wasm + 0x98)) {
      local_58 = (ulong)uVar5;
    }
    if (uVar5 != 0) {
      local_58 = (ulong)uVar5;
    }
    local_50 = &this->builder;
    local_40 = 0;
    i = 0;
    while (i != local_58) {
      Name::Name((Name *)local_80,"");
      Name::Name(&local_70,"");
      name_00.super_IString.str._M_str = (char *)local_80._0_8_;
      name_00.super_IString.str._M_len = (size_t)&local_38;
      Builder::makeDataSegment
                (name_00,(Name)stack0xffffffffffffff88,SUB81(local_70.super_IString.str._M_str,0),
                 (Expression *)0x0,(char *)0x0,(Address)0x19daac);
      _Var3._M_head_impl = local_38._M_head_impl;
      pMVar7 = this->wasm;
      local_60 = i;
      NVar11 = Name::fromInt(i);
      sVar12 = (string_view)Names::getValidDataSegmentName(pMVar7,NVar11);
      ((_Var3._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar12;
      ((_Var3._M_head_impl)->super_Importable).super_Named.hasExplicitName = false;
      uVar5 = Random::upTo(pRVar1,2);
      *(bool *)&((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
           uVar5 != 0;
      uVar5 = Random::upTo(pRVar1,(int)(this->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr * 2);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)&(local_38._M_head_impl)->initial,
                 (ulong)uVar5);
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        uVar6 = Random::upTo(pRVar1,0x200);
        *(char *)(((local_38._M_head_impl)->initial).addr + uVar10) = (char)uVar6;
      }
      if ((char)((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len == '\0') {
        Literal::makeFromInt32(&local_b0,local_40,(Type)*(uintptr_t *)(*local_48 + 0x50));
        pCVar8 = Builder::makeConst(local_50,&local_b0);
        ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)pCVar8;
        wasm::Literal::~Literal(&local_b0);
        local_40 = local_40 + uVar5;
        pcVar2 = (char *)((size_t *)*local_48)[1];
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
             *(size_t *)*local_48;
        ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar2;
      }
      wasm::Module::addDataSegment((unique_ptr *)this->wasm);
      std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
                ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_38
                );
      i = local_60 + 1;
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupMemory() {
  // Add a memory, if one does not already exist.
  if (wasm.memories.empty()) {
    auto memory = Builder::makeMemory("0");
    // Add at least one page of memory.
    memory->initial = 1 + upTo(10);
    // Make the max potentially higher, or unlimited.
    if (oneIn(2)) {
      memory->max = memory->initial + upTo(4);
    } else {
      memory->max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    if (wasm.features.hasMemory64() && oneIn(2)) {
      memory->addressType = Type::i64;
    }
    wasm.addMemory(std::move(memory));
  }

  auto& memory = wasm.memories[0];
  if (wasm.features.hasBulkMemory()) {
    size_t numSegments = upTo(8);
    // need at least one segment for memory.inits
    if (wasm.dataSegments.empty() && !numSegments) {
      numSegments = 1;
    }
    size_t memCovered = 0;
    for (size_t i = 0; i < numSegments; i++) {
      auto segment = builder.makeDataSegment();
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(i)),
                       false);
      segment->isPassive = bool(upTo(2));
      size_t segSize = upTo(fuzzParams->USABLE_MEMORY * 2);
      segment->data.resize(segSize);
      for (size_t j = 0; j < segSize; j++) {
        segment->data[j] = upTo(512);
      }
      if (!segment->isPassive) {
        segment->offset = builder.makeConst(
          Literal::makeFromInt32(memCovered, memory->addressType));
        memCovered += segSize;
        segment->memory = memory->name;
      }
      wasm.addDataSegment(std::move(segment));
    }
  } else {
    // init some data, especially if none exists before
    if (!oneIn(wasm.dataSegments.empty() ? 10 : 2)) {
      auto segment = builder.makeDataSegment();
      segment->memory = memory->name;
      segment->offset =
        builder.makeConst(Literal::makeFromInt32(0, memory->addressType));
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(0)),
                       false);
      auto num = upTo(fuzzParams->USABLE_MEMORY * 2);
      for (size_t i = 0; i < num; i++) {
        auto value = upTo(512);
        segment->data.push_back(value >= 256 ? 0 : (value & 0xff));
      }
      wasm.addDataSegment(std::move(segment));
    }
  }
}